

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# feature_resolver_test.cc
# Opt level: O2

FieldDescriptor *
google::protobuf::(anonymous_namespace)::
GetExtension<google::protobuf::internal::ExtensionIdentifier<google::protobuf::FeatureSet,google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,(unsigned_char)11,false>>
          (ExtensionIdentifier<google::protobuf::FeatureSet,_google::protobuf::internal::MessageTypeTraits<pb::TestFeatures>,_(unsigned_char)__v_,_false>
           *ext,Descriptor *descriptor)

{
  FieldDescriptor *pFVar1;
  FieldDescriptor *local_8;
  
  local_8 = DescriptorPool::FindExtensionByNumber(descriptor->file_->pool_,descriptor,ext->number_);
  pFVar1 = absl::lts_20250127::log_internal::DieIfNull<google::protobuf::FieldDescriptor_const*>
                     ("/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/feature_resolver_test.cc"
                      ,0x49,
                      "descriptor->file()->pool()->FindExtensionByNumber( descriptor, ext.number())"
                      ,&local_8);
  return pFVar1;
}

Assistant:

const FieldDescriptor* GetExtension(
    const ExtensionT& ext,
    const Descriptor* descriptor = FeatureSet::descriptor()) {
  return ABSL_DIE_IF_NULL(descriptor->file()->pool()->FindExtensionByNumber(
      descriptor, ext.number()));
}